

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

bool __thiscall
dxil_spv::CFGStructurizer::control_flow_is_escaping_from_loop
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  uint uVar1;
  CFGNode *pCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  CFGNode *this_00;
  pointer ppCVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  
  if (node != merge) {
    bVar5 = CFGNode::post_dominates(merge,node);
    if (!bVar5) {
      __assert_fail("merge->post_dominates(node)",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0xbc5,
                    "bool dxil_spv::CFGStructurizer::control_flow_is_escaping_from_loop(const CFGNode *, const CFGNode *) const"
                   );
    }
    this_00 = get_innermost_loop_header_for(this,this->entry_block,node);
    if ((this_00 != (CFGNode *)0x0) && (this_00->pred_back_edge != (CFGNode *)0x0)) {
      bVar6 = CFGNode::dominates(node,merge);
      pCVar2 = this_00->pred_back_edge;
      bVar10 = true;
      bVar5 = true;
      if (pCVar2 != node) {
        bVar5 = ((this->reachability_bitset).
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(ulong)(this->reachability_stride * node->forward_post_visit_order) +
                  (ulong)(pCVar2->forward_post_visit_order >> 5)] >>
                 (pCVar2->forward_post_visit_order & 0x1f) & 1) != 0;
        bVar10 = ((this->reachability_bitset).
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start
                  [(ulong)(this->reachability_stride * pCVar2->forward_post_visit_order) +
                   (ulong)(node->forward_post_visit_order >> 5)] >>
                  (node->forward_post_visit_order & 0x1f) & 1) != 0;
      }
      ppCVar3 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar4 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar3 == ppCVar4) {
        bVar9 = 1;
      }
      else {
        do {
          ppCVar8 = ppCVar3 + 1;
          pCVar2 = *ppCVar3;
          bVar7 = CFGNode::dominates(this_00,pCVar2);
          if (pCVar2 == this_00->pred_back_edge) {
            bVar11 = false;
          }
          else {
            uVar1 = this_00->pred_back_edge->forward_post_visit_order;
            bVar11 = ((this->reachability_bitset).
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(ulong)(this->reachability_stride * pCVar2->forward_post_visit_order) +
                       (ulong)(uVar1 >> 5)] >> (uVar1 & 0x1f) & 1) == 0;
          }
          bVar9 = 0;
        } while ((bVar7 && !bVar11) && (bVar9 = 1, ppCVar3 = ppCVar8, ppCVar8 != ppCVar4));
      }
      return (bool)(((bVar5 | bVar6 | bVar10) ^ 1U) & bVar9);
    }
  }
  return false;
}

Assistant:

bool CFGStructurizer::control_flow_is_escaping_from_loop(const CFGNode *node, const CFGNode *merge) const
{
	bool escaping_path = false;

	if (node == merge)
		return escaping_path;

	assert(merge->post_dominates(node));

	// First, test the loop scenario.
	// If we're inside a loop, we're a break construct if we can prove that:
	// - node has a loop header which dominates it.
	// - node cannot reach the continue block.
	// - Continue block cannot reach node.
	// - All post-domination frontiers can reach the continue block, meaning that at some point control flow
	//   decided to break out of the loop construct.
	auto *innermost_loop_header = get_innermost_loop_header_for(node);
	if (innermost_loop_header && innermost_loop_header->pred_back_edge)
	{
		bool dominates_merge = node->dominates(merge);
		bool can_reach_continue = query_reachability(*node, *innermost_loop_header->pred_back_edge);
		bool continue_can_reach = query_reachability(*innermost_loop_header->pred_back_edge, *node);
		bool pdf_can_reach_continue = true;

		for (auto *frontier : node->post_dominance_frontier)
		{
			bool header_dominates_frontier = innermost_loop_header->dominates(frontier);
			bool frontier_is_inside_loop_construct =
				query_reachability(*frontier, *innermost_loop_header->pred_back_edge);
			if (!header_dominates_frontier || !frontier_is_inside_loop_construct)
			{
				pdf_can_reach_continue = false;
				break;
			}
		}

		if (!dominates_merge && !continue_can_reach && !can_reach_continue && pdf_can_reach_continue)
			escaping_path = true;
	}

	return escaping_path;
}